

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

shared_ptr<minja::Expression> __thiscall minja::Parser::parseMathMulDiv(Parser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  pointer psVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  FilterExpr *this_00;
  runtime_error *prVar6;
  uint uVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Parser *in_RSI;
  shared_ptr<minja::Expression> sVar8;
  shared_ptr<minja::Expression> expr;
  shared_ptr<minja::Expression> left;
  shared_ptr<minja::Expression> right;
  vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
  parts;
  Op op;
  undefined4 uStack_64;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_60 [2];
  string op_str;
  
  parseMathUnaryPlusMinus((Parser *)&left);
  if (left.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"Expected left side of \'math mul/div\' expression");
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (parseMathMulDiv()::mul_div_tok_abi_cxx11_ == '\0') {
    iVar4 = __cxa_guard_acquire(&parseMathMulDiv()::mul_div_tok_abi_cxx11_);
    if (iVar4 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&parseMathMulDiv()::mul_div_tok_abi_cxx11_,"\\*\\*?|//?|%(?!\\})",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &parseMathMulDiv()::mul_div_tok_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&parseMathMulDiv()::mul_div_tok_abi_cxx11_);
    }
  }
  op_str._M_dataplus._M_p = (pointer)&op_str.field_2;
  op_str._M_string_length = 0;
  op_str.field_2._M_local_buf[0] = '\0';
  while( true ) {
    consumeToken((string *)&parts,in_RSI,&parseMathMulDiv()::mul_div_tok_abi_cxx11_,Strip);
    lVar5 = std::__cxx11::string::operator=((string *)&op_str,(string *)&parts);
    lVar5 = *(long *)(lVar5 + 8);
    std::__cxx11::string::~string((string *)&parts);
    if (lVar5 == 0) break;
    parseMathUnaryPlusMinus((Parser *)&right);
    if (right.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,"Expected right side of \'math mul/div\' expression")
      ;
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar3 = std::operator==(&op_str,"*");
    uVar7 = 3;
    if (!bVar3) {
      bVar3 = std::operator==(&op_str,"**");
      uVar7 = 4;
      if (!bVar3) {
        bVar3 = std::operator==(&op_str,"/");
        uVar7 = 5;
        if (!bVar3) {
          bVar3 = std::operator==(&op_str,"//");
          uVar7 = bVar3 ^ 7;
        }
      }
    }
    _op = (element_type *)CONCAT44(uStack_64,uVar7);
    get_location((Location *)&parts,in_RSI);
    std::
    make_shared<minja::BinaryOpExpr,minja::Location,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::Expression>,minja::BinaryOpExpr::Op&>
              ((Location *)&expr,(shared_ptr<minja::Expression> *)&parts,&left,(Op *)&right);
    std::__shared_ptr<minja::Expression,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<minja::Expression,(__gnu_cxx::_Lock_policy)2> *)&left,
               (__shared_ptr<minja::BinaryOpExpr,_(__gnu_cxx::_Lock_policy)2> *)&expr);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &parts.
                super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&right.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&right,"|",(allocator<char> *)&expr);
  consumeToken((string *)&parts,in_RSI,(string *)&right,Strip);
  psVar2 = parts.
           super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::string::~string((string *)&parts);
  std::__cxx11::string::~string((string *)&right);
  _Var1 = left.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  if (psVar2 == (pointer)0x0) {
    left.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              left.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = _Var1._M_pi;
    left.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    goto LAB_001c5e7a;
  }
  parseMathMulDiv((Parser *)&expr);
  if (expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
LAB_001c5ddf:
    parts.
    super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    parts.
    super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    parts.
    super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::shared_ptr<minja::Expression>,std::allocator<std::shared_ptr<minja::Expression>>>::
    emplace_back<std::shared_ptr<minja::Expression>>
              ((vector<std::shared_ptr<minja::Expression>,std::allocator<std::shared_ptr<minja::Expression>>>
                *)&parts,&left);
    std::
    vector<std::shared_ptr<minja::Expression>,std::allocator<std::shared_ptr<minja::Expression>>>::
    emplace_back<std::shared_ptr<minja::Expression>>
              ((vector<std::shared_ptr<minja::Expression>,std::allocator<std::shared_ptr<minja::Expression>>>
                *)&parts,&expr);
    get_location((Location *)&right,in_RSI);
    std::
    make_shared<minja::FilterExpr,minja::Location,std::vector<std::shared_ptr<minja::Expression>,std::allocator<std::shared_ptr<minja::Expression>>>>
              ((Location *)&op,
               (vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
                *)&right);
    _Var1._M_pi = a_Stack_60[0]._M_pi;
    a_Stack_60[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = _op;
    (this->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = _Var1._M_pi;
    _op = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&right.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    std::
    vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
    ::~vector(&parts);
  }
  else {
    this_00 = (FilterExpr *)
              __dynamic_cast(expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr,&Expression::typeinfo,&FilterExpr::typeinfo,0);
    if (this_00 == (FilterExpr *)0x0) goto LAB_001c5ddf;
    FilterExpr::prepend(this_00,&left);
    _Var1 = expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = _Var1._M_pi;
    expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
LAB_001c5e7a:
  std::__cxx11::string::~string((string *)&op_str);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&left.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar8.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar8.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<minja::Expression>)
         sVar8.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Expression> parseMathMulDiv() {
        auto left = parseMathUnaryPlusMinus();
        if (!left) throw std::runtime_error("Expected left side of 'math mul/div' expression");

        static std::regex mul_div_tok(R"(\*\*?|//?|%(?!\}))");
        std::string op_str;
        while (!(op_str = consumeToken(mul_div_tok)).empty()) {
            auto right = parseMathUnaryPlusMinus();
            if (!right) throw std::runtime_error("Expected right side of 'math mul/div' expression");
            auto op = op_str == "*" ? BinaryOpExpr::Op::Mul
                : op_str == "**" ? BinaryOpExpr::Op::MulMul
                : op_str == "/" ? BinaryOpExpr::Op::Div
                : op_str == "//" ? BinaryOpExpr::Op::DivDiv
                : BinaryOpExpr::Op::Mod;
            left = std::make_shared<BinaryOpExpr>(get_location(), std::move(left), std::move(right), op);
        }

        if (!consumeToken("|").empty()) {
            auto expr = parseMathMulDiv();
            if (auto filter = dynamic_cast<FilterExpr*>(expr.get())) {
                filter->prepend(std::move(left));
                return expr;
            } else {
                std::vector<std::shared_ptr<Expression>> parts;
                parts.emplace_back(std::move(left));
                parts.emplace_back(std::move(expr));
                return std::make_shared<FilterExpr>(get_location(), std::move(parts));
            }
        }
        return left;
    }